

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O2

tEdge __thiscall MeshLib::Solid::idEdge(Solid *this,int id0,int id1)

{
  Edge *pEVar1;
  ulong uVar2;
  ulong uVar3;
  Edge e;
  undefined1 local_78 [24];
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  Trait *local_40;
  
  local_60._M_p = (pointer)&local_50;
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_40 = (Trait *)0x0;
  uVar2 = (ulong)(uint)id1;
  if (id0 < id1) {
    uVar2 = (ulong)(uint)id0;
  }
  uVar3 = (ulong)(uint)id1;
  if (id1 < id0) {
    uVar3 = (ulong)(uint)id0;
  }
  local_78._16_8_ = uVar2 | uVar3 << 0x20;
  local_78._0_8_ = (HalfEdge *)0x0;
  local_78._8_8_ = (HalfEdge *)0x0;
  pEVar1 = AVL::Tree<MeshLib::Edge>::find(&this->m_edges,(Edge *)local_78);
  std::__cxx11::string::~string((string *)&local_60);
  return pEVar1;
}

Assistant:

Solid::tEdge Solid::idEdge( int id0, int id1 )
{
	Edge e(id0,id1);
	return  m_edges.find( &e );//insert a new vertex, with id as the key
}